

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLError __thiscall tinyxml2::XMLDocument::Parse(XMLDocument *this,char *p,size_t len)

{
  char *__dest;
  
  Clear(this);
  if ((p == (char *)0x0 || len == 0) || (*p == '\0')) {
    SetError(this,XML_ERROR_EMPTY_DOCUMENT,0,(char *)0x0);
  }
  else {
    if (len == 0xffffffffffffffff) {
      len = strlen(p);
    }
    __dest = (char *)operator_new__(len + 1);
    this->_charBuffer = __dest;
    memcpy(__dest,p,len);
    __dest[len] = '\0';
    Parse(this);
    if (this->_errorID != XML_SUCCESS) {
      XMLNode::DeleteChildren(&this->super_XMLNode);
      MemPoolT<120>::Clear(&this->_elementPool);
      MemPoolT<80>::Clear(&this->_attributePool);
      MemPoolT<112>::Clear(&this->_textPool);
      MemPoolT<104>::Clear(&this->_commentPool);
    }
  }
  return this->_errorID;
}

Assistant:

XMLError XMLDocument::Parse(const char* p, size_t len)
{
    Clear();

    if (len == 0 || !p || !*p) {
        SetError(XML_ERROR_EMPTY_DOCUMENT, 0, 0);
        return _errorID;
    }
    if (len == (size_t)(-1)) {
        len = strlen(p);
    }
    TIXMLASSERT(_charBuffer == 0);
    _charBuffer = new char[len + 1];
    memcpy(_charBuffer, p, len);
    _charBuffer[len] = 0;

    Parse();
    if (Error()) {
        // clean up now essentially dangling memory.
        // and the parse fail can put objects in the
        // pools that are dead and inaccessible.
        DeleteChildren();
        _elementPool.Clear();
        _attributePool.Clear();
        _textPool.Clear();
        _commentPool.Clear();
    }
    return _errorID;
}